

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileScalarOperation::Finalize<duckdb::hugeint_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,hugeint_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  TDigest *this_00;
  bool bVar1;
  reference pvVar2;
  int64_t iVar3;
  Value VVar4;
  
  if (state->pos != 0) {
    duckdb_tdigest::TDigest::process(state->h);
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    this_00 = state->h;
    pvVar2 = vector<float,_true>::operator[]((vector<float,_true> *)((this->bind_data).ptr + 8),0);
    VVar4 = duckdb_tdigest::TDigest::quantile(this_00,(double)*pvVar2);
    bVar1 = duckdb::TryCast::Operation<double,duckdb::hugeint_t>(VVar4,target,false);
    if (!bVar1) {
      iVar3 = 0x7fffffffffffffff;
      if (0.0 <= VVar4) {
        target->lower = 0xffffffffffffffff;
      }
      else {
        target->lower = 0;
        iVar3 = -0x8000000000000000;
      }
      target->upper = iVar3;
    }
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.h);
		D_ASSERT(finalize_data.input.bind_data);
		state.h->compress();
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto source = state.h->quantile(bind_data.quantiles[0]);
		ApproxQuantileCoding::Decode(source, target);
	}